

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

void opj_image_destroy(opj_image_t *image)

{
  long lVar1;
  void *in_RDI;
  opj_image_comp_t *image_comp;
  OPJ_UINT32 compno;
  undefined4 local_c;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 0x18) != 0) {
      for (local_c = 0; local_c < *(uint *)((long)in_RDI + 0x10); local_c = local_c + 1) {
        lVar1 = *(long *)((long)in_RDI + 0x18) + (ulong)local_c * 0x38;
        if (*(long *)(lVar1 + 0x30) != 0) {
          free(*(void **)(lVar1 + 0x30));
        }
      }
      free(*(void **)((long)in_RDI + 0x18));
    }
    if (*(long *)((long)in_RDI + 0x20) != 0) {
      free(*(void **)((long)in_RDI + 0x20));
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_image_destroy(opj_image_t *image) {
	if(image) {
		if(image->comps) {
			OPJ_UINT32 compno;

			/* image components */
			for(compno = 0; compno < image->numcomps; compno++) {
				opj_image_comp_t *image_comp = &(image->comps[compno]);
				if(image_comp->data) {
					opj_free(image_comp->data);
				}
			}
			opj_free(image->comps);
		}

		if(image->icc_profile_buf) {
			opj_free(image->icc_profile_buf);
		}

		opj_free(image);
	}
}